

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O1

Vector * Mul_MV(Matrix *M,Vector *V)

{
  size_t *psVar1;
  ElType **ppEVar2;
  Real *pRVar3;
  Real *pRVar4;
  LASErrIdType LVar5;
  Vector *V_00;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  char *Object2Name;
  ulong uVar10;
  size_t sVar11;
  size_t sVar12;
  Real *pRVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  
  M_Lock(M);
  V_Lock(V);
  LVar5 = LASResult();
  if (LVar5 == LASOK) {
    uVar10 = M->ClmDim;
    if (uVar10 == V->Dim) {
      sVar11 = M->RowDim;
      V_00 = (Vector *)malloc(0x30);
      pcVar6 = M_GetName(M);
      sVar7 = strlen(pcVar6);
      pcVar6 = V_GetName(V);
      sVar8 = strlen(pcVar6);
      pcVar6 = (char *)malloc(sVar7 + sVar8 + 10);
      pcVar9 = M_GetName(M);
      Object2Name = V_GetName(V);
      if ((V_00 == (Vector *)0x0) || (pcVar6 == (char *)0x0)) {
        LASError(LASMemAllocErr,"Mul_MV",pcVar9,Object2Name,(char *)0x0);
        if (V_00 != (Vector *)0x0) {
          free(V_00);
        }
      }
      else {
        sprintf(pcVar6,"(%s) * (%s)",pcVar9,Object2Name);
        V_Constr(V_00,pcVar6,sVar11,Tempor,True);
        LVar5 = LASResult();
        if (LVar5 == LASOK) {
          psVar1 = M->Len;
          ppEVar2 = M->El;
          pRVar3 = V->Cmp;
          pRVar4 = V_00->Cmp;
          if (M->ElOrder == Clmws) {
            V_SetAllCmp(V_00,0.0);
          }
          dVar16 = M->Multipl * V->Multipl;
          if (M->ElOrder == Clmws) {
            if (uVar10 != 0) {
              uVar14 = 1;
              uVar15 = -(ulong)(2.220446049250313e-15 <= ABS(dVar16 + -1.0));
              do {
                sVar11 = psVar1[uVar14];
                if (sVar11 != 0) {
                  dVar17 = pRVar3[uVar14];
                  pRVar13 = &ppEVar2[uVar14]->Val;
                  do {
                    pRVar4[((ElType *)(pRVar13 + -1))->Pos] =
                         *pRVar13 *
                         (double)((ulong)(dVar16 * dVar17) & uVar15 | ~uVar15 & (ulong)dVar17) +
                         pRVar4[((ElType *)(pRVar13 + -1))->Pos];
                    pRVar13 = pRVar13 + 2;
                    sVar11 = sVar11 - 1;
                  } while (sVar11 != 0);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 <= uVar10);
            }
          }
          else if ((M->ElOrder == Rowws) && (sVar11 != 0)) {
            uVar10 = 1;
            uVar14 = -(ulong)(2.220446049250313e-15 <= ABS(dVar16 + -1.0));
            do {
              sVar12 = psVar1[uVar10];
              if (sVar12 == 0) {
                dVar17 = 0.0;
              }
              else {
                pRVar13 = &ppEVar2[uVar10]->Val;
                dVar17 = 0.0;
                do {
                  dVar17 = dVar17 + *pRVar13 * pRVar3[((ElType *)(pRVar13 + -1))->Pos];
                  pRVar13 = pRVar13 + 2;
                  sVar12 = sVar12 - 1;
                } while (sVar12 != 0);
              }
              pRVar4[uVar10] = (Real)(~uVar14 & (ulong)dVar17 | (ulong)(dVar16 * dVar17) & uVar14);
              uVar10 = uVar10 + 1;
            } while (uVar10 <= sVar11);
          }
        }
      }
      if (pcVar6 != (char *)0x0) {
        free(pcVar6);
      }
    }
    else {
      pcVar6 = M_GetName(M);
      pcVar9 = V_GetName(V);
      V_00 = (Vector *)0x0;
      LASError(LASDimErr,"Mul_MV",pcVar6,pcVar9,(char *)0x0);
    }
  }
  else {
    V_00 = (Vector *)0x0;
  }
  M_Unlock(M);
  V_Unlock(V);
  return V_00;
}

Assistant:

Vector *Mul_MV(Matrix *M, Vector *V)
/* VRes = M * V */
{
    Vector *VRes;

    char *VResName;
    double MultiplMV;
    double Sum, Cmp;
    size_t RowDim, ClmDim, Row, Clm, Len, ElCount;
    size_t *MLen;
    Boolean MultiplMVIsOne;
    ElType **MEl, *PtrEl;
    Real *VCmp, *VResCmp;

    M_Lock(M);
    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (M->ClmDim == V->Dim) {
            RowDim = M->RowDim;
            ClmDim = M->ClmDim;
            VRes = (Vector *)malloc(sizeof(Vector));
            VResName = (char *)malloc((strlen(M_GetName(M)) + strlen(V_GetName(V)) + 10)
                           * sizeof(char));
            if (VRes != NULL && VResName != NULL) {
                sprintf(VResName, "(%s) * (%s)", M_GetName(M), V_GetName(V));
                V_Constr(VRes, VResName, RowDim, Tempor, True);
                if (LASResult() == LASOK) {
                    /* assignment of auxiliary lokal variables */
                    MLen = M->Len;
                    MEl = M->El;
                    VCmp = V->Cmp;
                    VResCmp = VRes->Cmp;

                    /* initialisation of the vector VRes */
                    if (M->ElOrder == Clmws)
                        V_SetAllCmp(VRes, 0.0);

                    /* analysis of multipliers of the matrix M and the vector V */
                    MultiplMV = M->Multipl * V->Multipl;
                    if (IsOne(MultiplMV)) {
                        MultiplMVIsOne = True;
                    } else {
                        MultiplMVIsOne = False;
                    }

                    /* multiplication of matrix elements by vector components */
                    if (M->ElOrder == Rowws) {
                        for (Row = 1; Row <= RowDim; Row++) {
                            Len = MLen[Row];
                            PtrEl = MEl[Row];
                            Sum = 0.0;
                            for (ElCount = Len; ElCount > 0; ElCount--) {
                                Sum += (*PtrEl).Val * VCmp[(*PtrEl).Pos];
                                PtrEl++;
                            }
                            if (MultiplMVIsOne)
                                VResCmp[Row] = Sum;
                            else
                                VResCmp[Row] = MultiplMV * Sum;
                        }
                    }
                    if (M->ElOrder == Clmws) {
                        for (Clm = 1; Clm <= ClmDim; Clm++) {
                            Len = MLen[Clm];
                            PtrEl = MEl[Clm];
                            if (MultiplMVIsOne)
                                   Cmp = VCmp[Clm];
                            else
                                Cmp = MultiplMV * VCmp[Clm];
                            for (ElCount = Len; ElCount > 0; ElCount--) {
                                VResCmp[(*PtrEl).Pos] += (*PtrEl).Val * Cmp;
                                PtrEl++;
                            }
                        }
                    }
                }
            } else {
                LASError(LASMemAllocErr, "Mul_MV", M_GetName(M), V_GetName(V), NULL);
                if (VRes != NULL)
                    free(VRes);
            }
            
            if (VResName != NULL)
                free(VResName);
        } else {
            LASError(LASDimErr, "Mul_MV", M_GetName(M), V_GetName(V), NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    M_Unlock(M);
    V_Unlock(V);
 
    return(VRes);
}